

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.cpp
# Opt level: O3

char * uv11::inet_ntop(int __af,void *__cp,char *__buf,socklen_t __len)

{
  int s;
  long lVar1;
  error_code eVar2;
  
  __buf[8] = '\0';
  __buf[9] = '\0';
  __buf[10] = '\0';
  __buf[0xb] = '\0';
  __buf[0xc] = '\0';
  __buf[0xd] = '\0';
  __buf[0xe] = '\0';
  __buf[0xf] = '\0';
  **(undefined1 **)__buf = 0;
  std::__cxx11::string::resize((ulong)__buf,'-');
  s = uv_inet_ntop(__af,__cp,*(undefined8 *)__buf,*(undefined8 *)(__buf + 8));
  if (s == 0) {
    lVar1 = std::__cxx11::string::find((char)__buf,0);
    if (lVar1 != -1) {
      std::__cxx11::string::resize((ulong)__buf,(char)lVar1);
      goto LAB_00106a90;
    }
  }
  __buf[8] = '\0';
  __buf[9] = '\0';
  __buf[10] = '\0';
  __buf[0xb] = '\0';
  __buf[0xc] = '\0';
  __buf[0xd] = '\0';
  __buf[0xe] = '\0';
  __buf[0xf] = '\0';
  **(undefined1 **)__buf = 0;
LAB_00106a90:
  eVar2 = make_error(s);
  return eVar2._0_8_;
}

Assistant:

Error uv11::inet_ntop(int af, const void* src, std::string& dst) {
    dst.clear();
    dst.resize(45, 0);

    int s = ::uv_inet_ntop(af, src, &dst.front(), dst.size());

    if (s) {
        dst.clear();
    } else {
        auto r = dst.find('\0');
        if (r == dst.npos) {
            dst.clear();
        } else {
            dst.resize(r);
        }
    }

    return make_error(s);
}